

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::FoldCmBool(BackwardPass *this,Instr *instr)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BOOLEAN BVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  RegOpnd *pRVar8;
  Opnd *pOVar9;
  
  if (instr->m_opcode != Conv_Bool) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2232,"(instr->m_opcode == Js::OpCode::Conv_Bool)",
                       "instr->m_opcode == Js::OpCode::Conv_Bool");
    if (!bVar2) goto LAB_003e3641;
    *puVar6 = 0;
  }
  if ((((this->tag == DeadStorePhase) && (this->currentPrePassLoop == (Loop *)0x0)) &&
      (this->isCollectionPass == false)) && (BVar5 = Func::HasTry(this->func), BVar5 == 0)) {
    pOVar9 = instr->m_src1;
    OVar3 = IR::Opnd::GetKind(pOVar9);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_003e3641;
      *puVar6 = 0;
    }
    if (*(char *)((long)pOVar9[1]._vptr_Opnd + 0x1c) != '\x03') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x2240,"(intOpnd->m_sym->IsInt32())","intOpnd->m_sym->IsInt32()");
      if (!bVar2) {
LAB_003e3641:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    this_00 = (Instr *)pOVar9[1]._vptr_Opnd[5];
    if ((((this_00 != (Instr *)0x0 & *(byte *)(pOVar9[1]._vptr_Opnd + 3)) == 1) &&
        (this_00->m_src2 != (Opnd *)0x0)) &&
       ((pIVar7 = IR::Instr::GetPrevRealInstrOrLabel(instr), pIVar7 == this_00 &&
        ((this_00->m_opcode - 0x1cf < 0xe || (this_00->m_opcode - 0x3b < 8)))))) {
      pRVar8 = IR::Opnd::AsRegOpnd(instr->m_dst);
      BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                        (this->currentBlock->upwardExposedUses,
                         *(BVIndex *)(pOVar9[1]._vptr_Opnd + 2));
      if ((BVar4 == '\0') &&
         (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                            (this->currentBlock->upwardExposedUses,(pRVar8->m_sym->super_Sym).m_id),
         BVar4 != '\0')) {
        pOVar9 = IR::Instr::UnlinkDst(instr);
        pRVar8 = IR::Opnd::AsRegOpnd(pOVar9);
        IR::Instr::ReplaceDst(this_00,&pRVar8->super_Opnd);
        BasicBlock::RemoveInstr(this->currentBlock,instr);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::FoldCmBool(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::Conv_Bool);

    if (this->tag != Js::DeadStorePhase || this->IsPrePass() || this->IsCollectionPass())
    {
        return false;
    }
    if (this->func->HasTry())
    {
        // UpwardExposedUsed info can't be relied on
        return false;
    }

    IR::RegOpnd *intOpnd = instr->GetSrc1()->AsRegOpnd();

    Assert(intOpnd->m_sym->IsInt32());

    if (!intOpnd->m_sym->IsSingleDef())
    {
        return false;
    }

    IR::Instr *cmInstr = intOpnd->m_sym->GetInstrDef();

    // Should be a Cm instr...
    if (!cmInstr->GetSrc2())
    {
        return false;
    }

    IR::Instr *instrPrev = instr->GetPrevRealInstrOrLabel();

    if (instrPrev != cmInstr)
    {
        return false;
    }

    switch (cmInstr->m_opcode)
    {
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmGe_A:
    case Js::OpCode::CmUnGe_A:
    case Js::OpCode::CmGt_A:
    case Js::OpCode::CmUnGt_A:
    case Js::OpCode::CmLt_A:
    case Js::OpCode::CmUnLt_A:
    case Js::OpCode::CmLe_A:
    case Js::OpCode::CmUnLe_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::CmEq_I4:
    case Js::OpCode::CmNeq_I4:
    case Js::OpCode::CmLt_I4:
    case Js::OpCode::CmLe_I4:
    case Js::OpCode::CmGt_I4:
    case Js::OpCode::CmGe_I4:
    case Js::OpCode::CmUnLt_I4:
    case Js::OpCode::CmUnLe_I4:
    case Js::OpCode::CmUnGt_I4:
    case Js::OpCode::CmUnGe_I4:
        break;

    default:
        return false;
    }

    IR::RegOpnd *varDst = instr->GetDst()->AsRegOpnd();

    if (this->currentBlock->upwardExposedUses->Test(intOpnd->m_sym->m_id) || !this->currentBlock->upwardExposedUses->Test(varDst->m_sym->m_id))
    {
        return false;
    }

    varDst = instr->UnlinkDst()->AsRegOpnd();

    cmInstr->ReplaceDst(varDst);

    this->currentBlock->RemoveInstr(instr);

    return true;
}